

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_collectgarbage(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  lua_Integer lVar5;
  
  iVar2 = luaL_checkoption(L,1,"collect",luaB_collectgarbage::opts);
  switch(""[iVar2]) {
  case '\x03':
    iVar2 = lua_gc(L,3);
    iVar3 = lua_gc(L,4);
    if (iVar2 != -1) {
      lua_pushnumber(L,(double)iVar3 * 0.0009765625 + (double)iVar2);
      return 1;
    }
    goto LAB_00122fbc;
  default:
    iVar2 = lua_gc(L,(int)""[iVar2]);
    if (iVar2 != -1) goto LAB_00122f7d;
    goto LAB_00122fbc;
  case '\x05':
    lVar5 = luaL_optinteger(L,2,0);
    iVar2 = lua_gc(L,5,lVar5);
    break;
  case '\x06':
    iVar2 = lua_gc(L,6);
    break;
  case '\a':
    iVar2 = 7;
    goto LAB_00122fd8;
  case '\b':
    iVar2 = 8;
LAB_00122fd8:
    iVar2 = lua_gc(L,iVar2);
    pushmode(L,iVar2);
    return 1;
  case '\t':
    iVar2 = luaL_checkoption(L,2,(char *)0x0,luaB_collectgarbage::params);
    cVar1 = ""[iVar2];
    uVar4 = luaL_optinteger(L,3,-1);
    iVar2 = lua_gc(L,9,(ulong)(uint)(int)cVar1,uVar4 & 0xffffffff);
LAB_00122f7d:
    lua_pushinteger(L,(long)iVar2);
    return 1;
  }
  if (iVar2 != -1) {
    lua_pushboolean(L,iVar2);
    return 1;
  }
LAB_00122fbc:
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_collectgarbage (lua_State *L) {
  static const char *const opts[] = {"stop", "restart", "collect",
    "count", "step", "isrunning", "generational", "incremental",
    "param", NULL};
  static const char optsnum[] = {LUA_GCSTOP, LUA_GCRESTART, LUA_GCCOLLECT,
    LUA_GCCOUNT, LUA_GCSTEP, LUA_GCISRUNNING, LUA_GCGEN, LUA_GCINC,
    LUA_GCPARAM};
  int o = optsnum[luaL_checkoption(L, 1, "collect", opts)];
  switch (o) {
    case LUA_GCCOUNT: {
      int k = lua_gc(L, o);
      int b = lua_gc(L, LUA_GCCOUNTB);
      checkvalres(k);
      lua_pushnumber(L, (lua_Number)k + ((lua_Number)b/1024));
      return 1;
    }
    case LUA_GCSTEP: {
      lua_Integer n = luaL_optinteger(L, 2, 0);
      int res = lua_gc(L, o, cast_sizet(n));
      checkvalres(res);
      lua_pushboolean(L, res);
      return 1;
    }
    case LUA_GCISRUNNING: {
      int res = lua_gc(L, o);
      checkvalres(res);
      lua_pushboolean(L, res);
      return 1;
    }
    case LUA_GCGEN: {
      return pushmode(L, lua_gc(L, o));
    }
    case LUA_GCINC: {
      return pushmode(L, lua_gc(L, o));
    }
    case LUA_GCPARAM: {
      static const char *const params[] = {
        "minormul", "majorminor", "minormajor",
        "pause", "stepmul", "stepsize", NULL};
      static const char pnum[] = {
        LUA_GCPMINORMUL, LUA_GCPMAJORMINOR, LUA_GCPMINORMAJOR,
        LUA_GCPPAUSE, LUA_GCPSTEPMUL, LUA_GCPSTEPSIZE};
      int p = pnum[luaL_checkoption(L, 2, NULL, params)];
      lua_Integer value = luaL_optinteger(L, 3, -1);
      lua_pushinteger(L, lua_gc(L, o, p, (int)value));
      return 1;
    }
    default: {
      int res = lua_gc(L, o);
      checkvalres(res);
      lua_pushinteger(L, res);
      return 1;
    }
  }
  luaL_pushfail(L);  /* invalid call (inside a finalizer) */
  return 1;
}